

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_copyout_str(char *str,void *dst,size_t *szp,nni_type t)

{
  char *pcVar1;
  char *s;
  nni_type t_local;
  size_t *szp_local;
  void *dst_local;
  char *str_local;
  
  if (t == NNI_TYPE_STRING) {
    pcVar1 = nni_strdup(str);
    if (pcVar1 == (char *)0x0) {
      str_local._4_4_ = 2;
    }
    else {
      *(char **)dst = pcVar1;
      str_local._4_4_ = 0;
    }
  }
  else {
    str_local._4_4_ = 0x1e;
  }
  return str_local._4_4_;
}

Assistant:

int
nni_copyout_str(const char *str, void *dst, size_t *szp, nni_type t)
{
	char *s;
	NNI_ARG_UNUSED(szp);
	if (t != NNI_TYPE_STRING) {
		return (NNG_EBADTYPE);
	}

	if ((s = nni_strdup(str)) == NULL) {
		return (NNG_ENOMEM);
	}
	*(char **) dst = s;
	return (0);
}